

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

char * BN_bn2hex(BIGNUM *a)

{
  bool bVar1;
  BN_ULONG **ppBVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int local_3c;
  int v;
  int j;
  int i;
  int z;
  char *p;
  char *buf;
  int width;
  BIGNUM *bn_local;
  
  v = bn_minimal_width((BIGNUM *)a);
  bn_local = (BIGNUM *)OPENSSL_malloc((long)(v * 0x10 + 3));
  if (bn_local == (BIGNUM *)0x0) {
    bn_local = (BIGNUM *)0x0;
  }
  else {
    _i = bn_local;
    if (a->neg != 0) {
      _i = (BIGNUM *)((long)&bn_local->d + 1);
      *(undefined1 *)&bn_local->d = 0x2d;
    }
    iVar3 = BN_is_zero((BIGNUM *)a);
    if (iVar3 != 0) {
      *(undefined1 *)&_i->d = 0x30;
      _i = (BIGNUM *)((long)&_i->d + 1);
    }
    bVar1 = false;
    while (v = v + -1, -1 < v) {
      for (local_3c = 0x38; -1 < local_3c; local_3c = local_3c + -8) {
        uVar5 = a->d[v] >> ((byte)local_3c & 0x3f);
        uVar4 = (uint)uVar5;
        if ((bVar1) || ((uVar5 & 0xff) != 0)) {
          ppBVar2 = &_i->d;
          *(char *)&_i->d = "0123456789abcdef"[(int)(uVar4 & 0xff) >> 4];
          _i = (BIGNUM *)((long)&_i->d + 2);
          *(char *)((long)ppBVar2 + 1) = "0123456789abcdef"[(int)(uVar4 & 0xf)];
          bVar1 = true;
        }
      }
    }
    *(undefined1 *)&_i->d = 0;
  }
  return (char *)bn_local;
}

Assistant:

char *BN_bn2hex(const BIGNUM *bn) {
  int width = bn_minimal_width(bn);
  char *buf = reinterpret_cast<char *>(
      OPENSSL_malloc(1 /* leading '-' */ + 1 /* zero is non-empty */ +
                     width * BN_BYTES * 2 + 1 /* trailing NUL */));
  if (buf == NULL) {
    return NULL;
  }

  char *p = buf;
  if (bn->neg) {
    *(p++) = '-';
  }

  if (BN_is_zero(bn)) {
    *(p++) = '0';
  }

  int z = 0;
  for (int i = width - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 8; j >= 0; j -= 8) {
      // strip leading zeros
      int v = ((int)(bn->d[i] >> (long)j)) & 0xff;
      if (z || v != 0) {
        *(p++) = hextable[v >> 4];
        *(p++) = hextable[v & 0x0f];
        z = 1;
      }
    }
  }
  *p = '\0';

  return buf;
}